

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::getCentroidalAverageVelocity
          (KinDynComputations *this,Span<double,__1L> vel)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  pointer __dest;
  Index size;
  SrcEvaluatorType srcEvaluator;
  ulong uVar4;
  uint uVar5;
  uint uVar7;
  Matrix<double,_6,_1,_0,_6,_1> ret;
  _func_int **local_98;
  KinDynComputationsPrivateAttributes *pKStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  KinDynComputations local_68;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  ulong uVar6;
  
  __dest = vel.storage_.data_;
  if (vel.storage_.super_extent_type<_1L>.size_.size_ == 6) {
    getCentroidalAverageVelocity(&local_68);
    local_98 = local_68._vptr_KinDynComputations;
    pKStack_90 = local_68.pimpl;
    local_88 = local_58;
    local_80 = local_50;
    uStack_78 = uStack_48;
    local_70 = local_40;
    uVar5 = (uint)((ulong)__dest >> 3) & 1;
    uVar6 = (ulong)uVar5;
    uVar4 = 6;
    if (((undefined1  [16])vel.storage_ & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      uVar4 = uVar6;
    }
    iVar1 = (int)uVar4;
    uVar7 = 6 - iVar1;
    if (uVar4 != 0) {
      memcpy(__dest,&local_98,(ulong)(uint)(iVar1 * 8));
    }
    uVar4 = (uVar7 & 0xfffffffe) + uVar4;
    if (((undefined1  [16])vel.storage_ & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
      uVar2 = (ulong)(uVar5 * 8);
      uVar3 = uVar6 + 2;
      if (uVar6 + 2 < uVar4) {
        uVar3 = uVar4;
      }
      memcpy((void *)((long)__dest + uVar2),(void *)((long)&local_98 + uVar2),
             (~uVar6 + uVar3 & 0xffffffffffffffe) * 8 + 0x10);
    }
    if ((uint)uVar4 < 6) {
      uVar4 = (ulong)((iVar1 + (uVar7 & 0xfffffffe)) * 8);
      memcpy((void *)((long)__dest + uVar4),(void *)((long)&local_98 + uVar4),(ulong)(uVar7 * 8 & 8)
            );
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
  }
  return vel.storage_.super_extent_type<_1L>.size_.size_ == 6;
}

Assistant:

bool KinDynComputations::getCentroidalAverageVelocity(Span<double> vel)
{
    constexpr int expected_spatial_velocity_size = 6;
    bool ok = vel.size() == expected_spatial_velocity_size;
    if( !ok )
    {
        reportError("KinDynComputations","getCentroidalAverageVelocity","Wrong size in input vel");
        return false;
    }

    toEigen(vel) = toEigen(getCentroidalAverageVelocity());

    return true;
}